

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O1

void embree::AccelN::intersect(Intersectors *This_in,RTCRayHit *ray,RayQueryContext *context)

{
  AccelData *pAVar1;
  long lVar2;
  ulong uVar3;
  
  pAVar1 = This_in->ptr;
  lVar2 = *(long *)&pAVar1[3].type;
  if (*(long *)&pAVar1[3].field_0x58 != lVar2) {
    uVar3 = 0;
    do {
      lVar2 = *(long *)(lVar2 + uVar3 * 8);
      if (*(float *)(lVar2 + 0x10) < INFINITY) {
        (**(code **)(lVar2 + 0x78))(lVar2 + 0x58,ray,context);
      }
      uVar3 = uVar3 + 1;
      lVar2 = *(long *)&pAVar1[3].type;
    } while (uVar3 < (ulong)(*(long *)&pAVar1[3].field_0x58 - lVar2 >> 3));
  }
  return;
}

Assistant:

void AccelN::intersect (Accel::Intersectors* This_in, RTCRayHit& ray, RayQueryContext* context) 
  {
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++)
      if (!This->accels[i]->isEmpty())
        This->accels[i]->intersectors.intersect(ray,context);
  }